

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<float>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<float>_> *this,list<long,_std::allocator<long>_> *singular)

{
  list<long,_std::allocator<long>_> *plVar1;
  list<long,_std::allocator<long>_> *plVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  double __x;
  double dVar7;
  double dVar8;
  complex<float> tmp2;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  int64_t k_1;
  int64_t j;
  complex<float> tmp;
  int64_t k;
  int64_t i;
  int64_t dim;
  complex<float> *in_stack_fffffffffffffea8;
  complex<float> in_stack_fffffffffffffeb0;
  list<long,_std::allocator<long>_> *in_stack_fffffffffffffeb8;
  list<long,_std::allocator<long>_> *in_stack_fffffffffffffec0;
  list<long,_std::allocator<long>_> *in_stack_fffffffffffffec8;
  undefined1 local_e8 [24];
  undefined1 local_d0 [56];
  undefined1 local_98 [8];
  long local_90;
  list<long,_std::allocator<long>_> *local_88;
  undefined1 local_78 [8];
  complex<float> local_70;
  complex<float> local_68 [6];
  undefined1 local_38 [8];
  long local_30;
  list<long,_std::allocator<long>_> *local_28;
  long local_20;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_000000b0,in_stack_000000a8);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 != iVar6) {
      Error(in_stack_000000b0,in_stack_000000a8);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_20 = CONCAT44(extraout_var,iVar4);
    for (local_28 = (list<long,_std::allocator<long>_> *)0x0; (long)local_28 < local_20;
        local_28 = (list<long,_std::allocator<long>_> *)
                   ((long)&(local_28->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node
                           .super__List_node_base._M_next + 1)) {
      for (local_30 = 0; plVar1 = local_28, local_30 < (long)local_28; local_30 = local_30 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        std::operator*(in_stack_fffffffffffffea8,(complex<float> *)0x12ac91b);
        std::operator-(in_stack_fffffffffffffea8,(complex<float> *)0x12ac939);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar1,plVar1,local_38);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28);
      dVar7 = fabs(__x);
      std::complex<float>::complex(local_68,1e-12,0.0);
      dVar8 = fabs((double)local_68[0]._M_value);
      if (SUB84(dVar7,0) <= SUB84(dVar8,0)) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (in_stack_fffffffffffffec0,(value_type_conflict5 *)in_stack_fffffffffffffeb8);
        plVar1 = local_28;
        std::complex<float>::complex(&local_70,1.0,0.0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar1,plVar1,&local_70);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28);
      std::sqrt<float>((complex<float> *)in_stack_fffffffffffffec8);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,local_78);
      local_88 = local_28;
      while (local_88 = (list<long,_std::allocator<long>_> *)
                        ((long)&(local_88->super__List_base<long,_std::allocator<long>_>)._M_impl.
                                _M_node.super__List_node_base._M_next + 1),
            (long)local_88 < local_20) {
        for (local_90 = 0; plVar2 = local_28, plVar1 = local_88, local_90 < (long)local_28;
            local_90 = local_90 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_90);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_90,local_88);
          std::operator*(in_stack_fffffffffffffea8,(complex<float> *)0x12acb96);
          std::operator-(in_stack_fffffffffffffea8,(complex<float> *)0x12acbb4);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar2,plVar1,local_98);
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28);
        bVar3 = IsZero(in_stack_fffffffffffffeb0);
        if (bVar3) {
          Error(in_stack_000000b0,in_stack_000000a8);
        }
        in_stack_fffffffffffffeb0._M_value = (_ComplexT)local_28;
        in_stack_fffffffffffffeb8 = local_88;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28);
        std::operator/(in_stack_fffffffffffffea8,(complex<float> *)0x12accb7);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffeb0._M_value,in_stack_fffffffffffffeb8,local_d0);
        in_stack_fffffffffffffec0 = local_88;
        in_stack_fffffffffffffec8 = local_28;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,local_e8);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}